

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b)

{
  reference pcVar1;
  char *pcVar2;
  long lVar3;
  LogMessage *other;
  LogFinisher local_8a;
  byte local_89;
  LogMessage local_88;
  char *local_50;
  char *out;
  reference local_40;
  char *begin;
  undefined1 local_21;
  AlphaNum *local_20;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_21 = 0;
  local_20 = a;
  b_local = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(local_20);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  out = (char *)std::__cxx11::string::begin();
  local_40 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  pcVar2 = Append2(local_40,b_local,local_20);
  pcVar1 = local_40;
  local_50 = pcVar2;
  lVar3 = std::__cxx11::string::size();
  local_89 = 0;
  if (pcVar2 != pcVar1 + lVar3) {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x5c5);
    local_89 = 1;
    other = internal::LogMessage::operator<<
                      (&local_88,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_8a,other);
  }
  if ((local_89 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b) {
  std::string result;
  result.resize(a.size() + b.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}